

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdGen * Cudd_FirstCube(DdManager *dd,DdNode *f,int **cube,double *value)

{
  DdNode *pDVar1;
  undefined1 auVar2 [16];
  DdGen *__ptr;
  int *__ptr_00;
  DdNode **__s;
  int iVar3;
  long lVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  int iVar11;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar13;
  
  if (f != (DdNode *)0x0 && dd != (DdManager *)0x0) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr == (DdGen *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr->manager = dd;
      *(undefined1 (*) [16])&__ptr->type = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&__ptr->gen + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])&(__ptr->stack).stack = (undefined1  [16])0x0;
      iVar3 = dd->size;
      __ptr_00 = (int *)malloc((long)iVar3 * 4);
      (__ptr->gen).cubes.cube = __ptr_00;
      auVar2 = _DAT_007ee2e0;
      if (__ptr_00 == (int *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        if (0 < iVar3) {
          lVar4 = (long)iVar3 + -1;
          auVar10._8_4_ = (int)lVar4;
          auVar10._0_8_ = lVar4;
          auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
          lVar4 = 0;
          auVar10 = auVar10 ^ _DAT_007ee2e0;
          auVar12 = _DAT_007ee2c0;
          auVar14 = _DAT_007ee2d0;
          do {
            auVar15 = auVar14 ^ auVar2;
            iVar11 = auVar10._4_4_;
            if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                        iVar11 < auVar15._4_4_) & 1)) {
              *(undefined4 *)((long)__ptr_00 + lVar4) = 2;
            }
            if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
                auVar15._12_4_ <= auVar10._12_4_) {
              *(undefined4 *)((long)__ptr_00 + lVar4 + 4) = 2;
            }
            auVar15 = auVar12 ^ auVar2;
            iVar16 = auVar15._4_4_;
            if (iVar16 <= iVar11 && (iVar16 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
              *(undefined4 *)((long)__ptr_00 + lVar4 + 8) = 2;
              *(undefined4 *)((long)__ptr_00 + lVar4 + 0xc) = 2;
            }
            lVar13 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 4;
            auVar14._8_8_ = lVar13 + 4;
            lVar13 = auVar12._8_8_;
            auVar12._0_8_ = auVar12._0_8_ + 4;
            auVar12._8_8_ = lVar13 + 4;
            lVar4 = lVar4 + 0x10;
          } while ((ulong)(iVar3 + 3U >> 2) << 4 != lVar4);
        }
        __s = (DdNode **)malloc((long)(int)(iVar3 + 1U) << 3);
        (__ptr->stack).stack = __s;
        if (__s != (DdNode **)0x0) {
          if (-1 < iVar3) {
            memset(__s,0,(ulong)(iVar3 + 1U) << 3);
          }
          *__s = f;
          iVar3 = 1;
          while( true ) {
            while( true ) {
              lVar4 = (long)iVar3;
              pDVar5 = __s[lVar4 + -1];
              pDVar6 = (DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe);
              if ((ulong)pDVar6->index == 0x7fffffff) break;
              __ptr_00[pDVar6->index] = 0;
              pDVar1 = (pDVar6->type).kids.E;
              pDVar8 = (DdNode *)((ulong)pDVar1 ^ 1);
              if (pDVar5 == pDVar6) {
                pDVar8 = pDVar1;
              }
              __s[lVar4] = pDVar8;
              iVar3 = iVar3 + 1;
            }
            if ((pDVar5 != (DdNode *)((ulong)dd->one ^ 1)) && (pDVar5 != dd->background)) break;
            if (iVar3 == 1) {
LAB_007a3ccb:
              __ptr->status = 0;
              (__ptr->stack).sp = 0;
              dVar9 = (__ptr->gen).cubes.value;
LAB_007a3cd8:
              *cube = __ptr_00;
              *value = dVar9;
              return __ptr;
            }
            lVar4 = lVar4 + -1;
            while( true ) {
              pDVar6 = __s[lVar4 + -1];
              pDVar7 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
              pDVar1 = (pDVar7->type).kids.T;
              pDVar8 = (DdNode *)((ulong)pDVar1 ^ 1);
              if (pDVar6 == pDVar7) {
                pDVar8 = pDVar1;
              }
              if (pDVar8 != pDVar5) break;
              __ptr_00[pDVar7->index] = 2;
              iVar3 = iVar3 + -1;
              lVar4 = lVar4 + -1;
              pDVar5 = pDVar6;
              if (lVar4 == 0) goto LAB_007a3ccb;
            }
            __ptr_00[pDVar7->index] = 1;
            __s[lVar4] = pDVar8;
          }
          (__ptr->stack).sp = iVar3;
          __ptr->status = 1;
          dVar9 = (pDVar5->type).value;
          (__ptr->gen).cubes.value = dVar9;
          goto LAB_007a3cd8;
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  return (DdGen *)0x0;
}

Assistant:

DdGen *
Cudd_FirstCube(
  DdManager * dd,
  DdNode * f,
  int ** cube,
  CUDD_VALUE_TYPE * value)
{
    DdGen *gen;
    DdNode *top, *treg, *next, *nreg, *prev, *preg;
    int i;
    int nvars;

    /* Sanity Check. */
    if (dd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_CUBES;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = dd->size;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first cube of the onset. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        if (!cuddIsConstant(treg)) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[treg->index] = 0;
            next = cuddE(treg);
            if (top != treg) next = Cudd_Not(next);
            gen->stack.stack[gen->stack.sp] = next; gen->stack.sp++;
        } else if (top == Cudd_Not(DD_ONE(dd)) || top == dd->background) {
            /* Backtrack */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = gen->stack.stack[gen->stack.sp-2];
                preg = Cudd_Regular(prev);
                nreg = cuddT(preg);
                if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[preg->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[preg->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
                treg = Cudd_Regular(top);
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(top);
            goto done;
        }
    }

done:
    *cube = gen->gen.cubes.cube;
    *value = gen->gen.cubes.value;
    return(gen);

}